

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O2

void __thiscall
Assimp::XFileParser::ParseDataObjectAnimationKey(XFileParser *this,AnimBone *pAnimBone)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  vector<aiVectorKey,_std::allocator<aiVectorKey>_> *this_00;
  bool bVar5;
  ai_real aVar6;
  aiVector3D aVar7;
  MatrixKey key;
  string local_1c8;
  undefined1 local_1a8 [32];
  undefined8 local_188;
  undefined8 uStack_180;
  float local_178;
  undefined8 local_174;
  undefined8 uStack_16c;
  float local_164;
  
  readHeadOfDataObject(this,(string *)0x0);
  uVar1 = ReadInt(this);
  uVar2 = ReadInt(this);
  this_00 = &pAnimBone->mPosKeys;
  if (uVar1 != 2) {
    this_00 = &pAnimBone->mScaleKeys;
  }
  do {
    bVar5 = uVar2 == 0;
    uVar2 = uVar2 - 1;
    if (bVar5) {
      CheckForClosingBrace(this);
      return;
    }
    uVar3 = ReadInt(this);
    if (uVar1 - 1 < 2) {
      uVar4 = ReadInt(this);
      if (uVar4 != 3) {
        std::__cxx11::string::string
                  ((string *)local_1a8,"Invalid number of arguments for vector key in animation",
                   (allocator *)&local_1c8);
        ThrowException(this,(string *)local_1a8);
      }
      local_1a8._16_4_ = 0.0;
      local_1a8._8_4_ = 0.0;
      local_1a8._12_4_ = 0.0;
      local_1a8._0_8_ = (undefined8)uVar3;
      aVar7 = ReadVector3(this);
      local_1a8._16_4_ = aVar7.z;
      local_1a8._8_4_ = aVar7.x;
      local_1a8._12_4_ = aVar7.y;
      std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::push_back
                (this_00,(value_type *)local_1a8);
    }
    else {
      if (uVar1 - 3 < 2) {
        uVar4 = ReadInt(this);
        if (uVar4 != 0x10) {
          std::__cxx11::string::string
                    ((string *)local_1a8,"Invalid number of arguments for matrix key in animation",
                     (allocator *)&local_1c8);
          ThrowException(this,(string *)local_1a8);
        }
        local_1a8._8_4_ = 1.0;
        local_1a8._12_4_ = 0.0;
        local_1a8._16_4_ = 0.0;
        local_1a8._20_4_ = 0.0;
        local_1a8._24_4_ = 0.0;
        local_1a8._28_4_ = 1.0;
        local_188._0_4_ = 0.0;
        local_188._4_4_ = 0.0;
        uStack_180._0_4_ = 0.0;
        uStack_180._4_4_ = 0.0;
        local_178 = 1.0;
        local_174._0_4_ = 0.0;
        local_174._4_4_ = 0.0;
        uStack_16c._0_4_ = 0.0;
        uStack_16c._4_4_ = 0.0;
        local_164 = 1.0;
        local_1a8._0_8_ = (undefined8)uVar3;
        local_1a8._8_4_ = ReadFloat(this);
        local_1a8._24_4_ = ReadFloat(this);
        aVar6 = ReadFloat(this);
        uStack_180._0_4_ = aVar6;
        aVar6 = ReadFloat(this);
        local_174._4_4_ = aVar6;
        local_1a8._12_4_ = ReadFloat(this);
        local_1a8._28_4_ = ReadFloat(this);
        aVar6 = ReadFloat(this);
        uStack_180._4_4_ = aVar6;
        aVar6 = ReadFloat(this);
        uStack_16c._0_4_ = aVar6;
        local_1a8._16_4_ = ReadFloat(this);
        aVar6 = ReadFloat(this);
        local_188._0_4_ = aVar6;
        local_178 = ReadFloat(this);
        aVar6 = ReadFloat(this);
        uStack_16c._4_4_ = aVar6;
        local_1a8._20_4_ = ReadFloat(this);
        aVar6 = ReadFloat(this);
        local_188._4_4_ = aVar6;
        local_174._0_4_ = ReadFloat(this);
        local_164 = ReadFloat(this);
        std::vector<Assimp::XFile::MatrixKey,_std::allocator<Assimp::XFile::MatrixKey>_>::push_back
                  (&pAnimBone->mTrafoKeys,(value_type *)local_1a8);
      }
      else {
        if (uVar1 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::operator<<((ostream *)local_1a8,"Unknown key type ");
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::operator<<((ostream *)local_1a8," in animation.");
          std::__cxx11::stringbuf::str();
          ThrowException(this,&local_1c8);
        }
        uVar4 = ReadInt(this);
        if (uVar4 != 4) {
          std::__cxx11::string::string
                    ((string *)local_1a8,
                     "Invalid number of arguments for quaternion key in animation",
                     (allocator *)&local_1c8);
          ThrowException(this,(string *)local_1a8);
        }
        local_1a8._8_4_ = 1.0;
        local_1a8._12_4_ = 0.0;
        local_1a8._16_4_ = 0.0;
        local_1a8._20_4_ = 0.0;
        local_1a8._0_8_ = (undefined8)uVar3;
        local_1a8._8_4_ = ReadFloat(this);
        local_1a8._12_4_ = ReadFloat(this);
        local_1a8._16_4_ = ReadFloat(this);
        local_1a8._20_4_ = ReadFloat(this);
        std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::push_back
                  (&pAnimBone->mRotKeys,(value_type *)local_1a8);
      }
      CheckForSemicolon(this);
    }
    CheckForSeparator(this);
  } while( true );
}

Assistant:

void XFileParser::ParseDataObjectAnimationKey( AnimBone* pAnimBone)
{
    readHeadOfDataObject();

    // read key type
    unsigned int keyType = ReadInt();

    // read number of keys
    unsigned int numKeys = ReadInt();

    for( unsigned int a = 0; a < numKeys; a++)
    {
        // read time
        unsigned int time = ReadInt();

        // read keys
        switch( keyType)
        {
            case 0: // rotation quaternion
            {
                // read count
                if( ReadInt() != 4)
                    ThrowException( "Invalid number of arguments for quaternion key in animation");

                aiQuatKey key;
                key.mTime = double( time);
                key.mValue.w = ReadFloat();
                key.mValue.x = ReadFloat();
                key.mValue.y = ReadFloat();
                key.mValue.z = ReadFloat();
                pAnimBone->mRotKeys.push_back( key);

                CheckForSemicolon();
                break;
            }

            case 1: // scale vector
            case 2: // position vector
            {
                // read count
                if( ReadInt() != 3)
                    ThrowException( "Invalid number of arguments for vector key in animation");

                aiVectorKey key;
                key.mTime = double( time);
                key.mValue = ReadVector3();

                if( keyType == 2)
                    pAnimBone->mPosKeys.push_back( key);
                else
                    pAnimBone->mScaleKeys.push_back( key);

                break;
            }

            case 3: // combined transformation matrix
            case 4: // denoted both as 3 or as 4
            {
                // read count
                if( ReadInt() != 16)
                    ThrowException( "Invalid number of arguments for matrix key in animation");

                // read matrix
                MatrixKey key;
                key.mTime = double( time);
                key.mMatrix.a1 = ReadFloat(); key.mMatrix.b1 = ReadFloat();
                key.mMatrix.c1 = ReadFloat(); key.mMatrix.d1 = ReadFloat();
                key.mMatrix.a2 = ReadFloat(); key.mMatrix.b2 = ReadFloat();
                key.mMatrix.c2 = ReadFloat(); key.mMatrix.d2 = ReadFloat();
                key.mMatrix.a3 = ReadFloat(); key.mMatrix.b3 = ReadFloat();
                key.mMatrix.c3 = ReadFloat(); key.mMatrix.d3 = ReadFloat();
                key.mMatrix.a4 = ReadFloat(); key.mMatrix.b4 = ReadFloat();
                key.mMatrix.c4 = ReadFloat(); key.mMatrix.d4 = ReadFloat();
                pAnimBone->mTrafoKeys.push_back( key);

                CheckForSemicolon();
                break;
            }

            default:
                ThrowException( format() << "Unknown key type " << keyType << " in animation." );
                break;
        } // end switch

        // key separator
        CheckForSeparator();
    }

    CheckForClosingBrace();
}